

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O1

void __thiscall
TEST_GROUP_CppUTestGroupMemoryReporterPlugin::teardown
          (TEST_GROUP_CppUTestGroupMemoryReporterPlugin *this)

{
  MockSupport *pMVar1;
  SimpleString local_20;
  
  setCurrentNewAllocator(previousNewAllocator);
  SimpleString::SimpleString(&local_20,"");
  pMVar1 = mock(&local_20,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x27])(pMVar1);
  SimpleString::~SimpleString(&local_20);
  if (this->reporter != (MemoryReporterPluginUnderTest *)0x0) {
    (*(this->reporter->super_MemoryReporterPlugin).super_TestPlugin._vptr_TestPlugin[1])();
  }
  if (this->test != (UtestShell *)0x0) {
    (*this->test->_vptr_UtestShell[1])();
  }
  if (this->result != (TestResult *)0x0) {
    (*this->result->_vptr_TestResult[1])();
  }
  return;
}

Assistant:

void teardown() _override
    {
        setCurrentNewAllocator(previousNewAllocator);
        mock().clear();
        delete reporter;
        delete test;
        delete result;
    }